

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

void __thiscall QUrlModel::setFileSystemModel(QUrlModel *this,QFileSystemModel *model)

{
  ConnectionType type;
  long lVar1;
  long in_FS_OFFSET;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fileSystemModel != model) {
    if (this->fileSystemModel != (QFileSystemModel *)0x0) {
      for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
        QObject::disconnect((Connection *)(&(this->modelConnections).field_0x0 + lVar1));
      }
    }
    this->fileSystemModel = model;
    if (model != (QFileSystemModel *)0x0) {
      type = (ConnectionType)this;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QUrlModel::*)(QModelIndex_const&,QModelIndex_const&)>
                ((Object *)local_40,(offset_in_QAbstractItemModel_to_subr)model,
                 (ContextType *)QAbstractItemModel::dataChanged,(offset_in_QUrlModel_to_subr *)0x0,
                 type);
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QUrlModel::*)()>
                ((Object *)&local_38,(offset_in_QAbstractItemModel_to_subr)model,
                 (ContextType *)QAbstractItemModel::layoutChanged,(offset_in_QUrlModel_to_subr *)0x0
                 ,type);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QUrlModel::*)()>
                ((Object *)&uStack_30,(offset_in_QAbstractItemModel_to_subr)model,
                 (ContextType *)QAbstractItemModel::rowsRemoved,(offset_in_QUrlModel_to_subr *)0x0,
                 type);
      std::array<QMetaObject::Connection,_3UL>::operator=
                (&this->modelConnections,(array<QMetaObject::Connection,_3UL> *)local_40);
      std::array<QMetaObject::Connection,_3UL>::~array
                ((array<QMetaObject::Connection,_3UL> *)local_40);
    }
    QStandardItemModel::clear();
    local_40 = (undefined1  [8])0xffffffffffffffff;
    local_38 = 0;
    uStack_30 = 0;
    (**(code **)(*(long *)this + 0x100))(this,0,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUrlModel::setFileSystemModel(QFileSystemModel *model)
{
    if (model == fileSystemModel)
        return;
    if (fileSystemModel != nullptr) {
        for (const auto &conn : std::as_const(modelConnections))
            disconnect(conn);
    }
    fileSystemModel = model;
    if (fileSystemModel != nullptr) {
        modelConnections = {
            connect(model, &QFileSystemModel::dataChanged,
                    this, &QUrlModel::dataChanged),
            connect(model, &QFileSystemModel::layoutChanged,
                    this, &QUrlModel::layoutChanged),
            connect(model, &QFileSystemModel::rowsRemoved,
                    this, &QUrlModel::layoutChanged),
        };
    }
    clear();
    insertColumns(0, 1);
}